

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgException.h
# Opt level: O2

string * __thiscall
TCLAP::ArgException::argId_abi_cxx11_(string *__return_storage_ptr__,ArgException *this)

{
  bool bVar1;
  allocator<char> local_11;
  
  bVar1 = std::operator==(&this->_argId,"undefined");
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__," ",&local_11);
  }
  else {
    std::operator+(__return_storage_ptr__,"Argument: ",&this->_argId);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string argId() const  
		{ 
			if ( _argId == "undefined" )
				return " ";
			else
				return ( "Argument: " + _argId ); 
		}